

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

string * __thiscall QHybrid::SoftPrintBrief_abi_cxx11_(string *__return_storage_ptr__,QHybrid *this)

{
  QFunctionJointBeliefInterface *pQVar1;
  ostream *poVar2;
  Qheur_t Qheur;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"QHybrid_",8);
  qheur::SoftPrint_abi_cxx11_(&local_1c8,(qheur *)(ulong)this->_m_QheurTypeFirstTS,Qheur);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  pQVar1 = this->_m_QlastTimeSteps;
  if (pQVar1 == (QFunctionJointBeliefInterface *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"noQlast",7);
  }
  else {
    (**(code **)(*(long *)((long)&pQVar1->field_0x0 + *(long *)((long)*pQVar1 + -0x60)) + 0x48))
              (&local_1c8,(long)&pQVar1->field_0x0 + *(long *)((long)*pQVar1 + -0x60));
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"_hLT",4);
  if (this->_m_optimizedHorLast == true) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"0",1);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string QHybrid::SoftPrintBrief() const
{
    stringstream ss;
    ss << "QHybrid_"
       << SoftPrint(_m_QheurTypeFirstTS)
       << "_";
    if(_m_QlastTimeSteps)
        ss << _m_QlastTimeSteps->SoftPrintBrief();
    else
        ss << "noQlast";
    ss << "_hLT";
    if(_m_optimizedHorLast)
        ss << "0";
    else
        ss <<_m_horizonLastTimeSteps;
    return(ss.str());
}